

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.cpp
# Opt level: O2

void __thiscall Diligent::DXCompilerLibrary::DetectMaxShaderModel(DXCompilerLibrary *this)

{
  CComPtr<IDxcBlobEncoding> CVar1;
  CComPtr<IDxcCompiler> CVar2;
  CComPtr<IDxcLibrary> CVar3;
  _Alloc_hider _Var4;
  HRESULT HVar5;
  int iVar6;
  IDxcLibrary **ppIVar7;
  IDxcCompiler **ppIVar8;
  IDxcBlobEncoding **ppIVar9;
  IDxcOperationResult **ppIVar10;
  char (*in_RCX) [31];
  long lVar11;
  uint uVar12;
  DxcCreateInstanceProc p_Var13;
  uint __val;
  char *pcVar14;
  string *psVar15;
  ulong uVar16;
  pointer ppwVar17;
  byte bVar18;
  HRESULT status;
  CComPtr<IDxcBlobEncoding> pSourceBlob;
  CComPtr<IDxcCompiler> pdxcCompiler;
  CComPtr<IDxcLibrary> pdxcLibrary;
  vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> DxilArgs;
  CComPtr<IDxcOperationResult> pdxcResult;
  wstring Profile;
  string msg;
  
  bVar18 = 0;
  p_Var13 = this->m_DxcCreateInstance;
  if (p_Var13 == (DxcCreateInstanceProc)0x0) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_DxcCreateInstance != nullptr",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x4d);
    std::__cxx11::string::~string((string *)&msg);
    p_Var13 = this->m_DxcCreateInstance;
  }
  pdxcLibrary.super_CComPtrBase<IDxcLibrary>.p = (CComPtrBase<IDxcLibrary>)(IDxcLibrary *)0x0;
  ppIVar7 = CComPtrBase<IDxcLibrary>::operator&(&pdxcLibrary.super_CComPtrBase<IDxcLibrary>);
  HVar5 = (*p_Var13)(&CLSID_DxcLibrary,(REFIID)_GUID_e5204dc7_d18c_4c3c_bdfb_851673980fe7,ppIVar7);
  if (HVar5 < 0) {
    LogError<true,char[29]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x51,(char (*) [29])"Failed to create DXC Library");
  }
  pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p = (CComPtrBase<IDxcCompiler>)(IDxcCompiler *)0x0;
  p_Var13 = this->m_DxcCreateInstance;
  ppIVar8 = CComPtrBase<IDxcCompiler>::operator&(&pdxcCompiler.super_CComPtrBase<IDxcCompiler>);
  HVar5 = (*p_Var13)(&CLSID_DxcCompiler,(REFIID)_GUID_8c210bf3_011f_4422_8d70_6f9acb8db617,ppIVar8);
  if (HVar5 < 0) {
    LogError<true,char[30]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x54,(char (*) [30])"Failed to create DXC Compiler");
  }
  CVar3.super_CComPtrBase<IDxcLibrary>.p = pdxcLibrary.super_CComPtrBase<IDxcLibrary>.p;
  pcVar14 = "\nfloat4 main() : SV_Target0\n{\n    return float4(0.0, 0.0, 0.0, 0.0);\n}\n";
  psVar15 = &msg;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    (psVar15->_M_dataplus)._M_p = *(pointer *)pcVar14;
    pcVar14 = pcVar14 + ((ulong)bVar18 * -2 + 1) * 8;
    psVar15 = (string *)((long)psVar15 + (ulong)bVar18 * -0x10 + 8);
  }
  pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p =
       (CComPtrBase<IDxcBlobEncoding>)(IDxcBlobEncoding *)0x0;
  ppIVar9 = CComPtrBase<IDxcBlobEncoding>::operator&
                      (&pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>);
  iVar6 = (**(code **)(*(long *)CVar3.super_CComPtrBase<IDxcLibrary>.p + 0x30))
                    (CVar3.super_CComPtrBase<IDxcLibrary>.p,&msg,0x48,0xfde9,ppIVar9);
  if (iVar6 < 0) {
    LogError<true,char[35]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x5e,(char (*) [35])"Failed to create DXC Blob Encoding");
  }
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_Target == Vulkan) {
    Profile._M_dataplus._M_p = L"-spirv";
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,
               (wchar_t **)&Profile);
  }
  __val = 0;
  while( true ) {
    uVar12 = __val;
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&Profile,L"ps_6_",(allocator<wchar_t> *)&pdxcResult);
    __val = uVar12 + 1;
    std::__cxx11::to_wstring((wstring *)&pdxcResult,__val);
    std::__cxx11::wstring::append((wstring *)&Profile);
    std::__cxx11::wstring::~wstring((wstring *)&pdxcResult);
    _Var4 = Profile._M_dataplus;
    CVar2 = pdxcCompiler;
    CVar1 = pSourceBlob;
    pdxcResult.super_CComPtrBase<IDxcOperationResult>.p =
         (CComPtrBase<IDxcOperationResult>)(IDxcOperationResult *)0x0;
    uVar16 = (long)DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    ppwVar17 = (pointer)0x0;
    if (uVar16 != 0) {
      ppwVar17 = DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    }
    ppIVar10 = CComPtrBase<IDxcOperationResult>::operator&
                         ((CComPtrBase<IDxcOperationResult> *)&pdxcResult);
    iVar6 = (**(code **)(*(long *)CVar2.super_CComPtrBase<IDxcCompiler>.p + 0x18))
                      (CVar2.super_CComPtrBase<IDxcCompiler>.p,
                       CVar1.super_CComPtrBase<IDxcBlobEncoding>.p,L"",L"main",_Var4._M_p,ppwVar17,
                       uVar16 >> 3,0,0,0,ppIVar10);
    if (iVar6 < 0) break;
    status = -0x7fffbffb;
    iVar6 = (**(code **)(*(long *)pdxcResult.super_CComPtrBase<IDxcOperationResult>.p + 0x18))
                      (pdxcResult.super_CComPtrBase<IDxcOperationResult>.p,&status);
    HVar5 = status;
    CComPtrBase<IDxcOperationResult>::~CComPtrBase((CComPtrBase<IDxcOperationResult> *)&pdxcResult);
    std::__cxx11::wstring::~wstring((wstring *)&Profile);
    if ((iVar6 < 0) || (HVar5 < 0)) goto LAB_0031f260;
  }
  CComPtrBase<IDxcOperationResult>::~CComPtrBase(&pdxcResult.super_CComPtrBase<IDxcOperationResult>)
  ;
  std::__cxx11::wstring::~wstring((wstring *)&Profile);
LAB_0031f260:
  this->m_MaxShaderModel = (ShaderVersion)((ulong)uVar12 << 0x20 | 6);
  std::_Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::~_Vector_base
            (&DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>);
  CComPtrBase<IDxcBlobEncoding>::~CComPtrBase(&pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>);
  CComPtrBase<IDxcCompiler>::~CComPtrBase(&pdxcCompiler.super_CComPtrBase<IDxcCompiler>);
  CComPtrBase<IDxcLibrary>::~CComPtrBase(&pdxcLibrary.super_CComPtrBase<IDxcLibrary>);
  return;
}

Assistant:

void DXCompilerLibrary::DetectMaxShaderModel()
{
    VERIFY_EXPR(m_DxcCreateInstance != nullptr);
    try
    {
        CComPtr<IDxcLibrary> pdxcLibrary;
        CHECK_D3D_RESULT(m_DxcCreateInstance(CLSID_DxcLibrary, IID_PPV_ARGS(&pdxcLibrary)), "Failed to create DXC Library");

        CComPtr<IDxcCompiler> pdxcCompiler;
        CHECK_D3D_RESULT(m_DxcCreateInstance(CLSID_DxcCompiler, IID_PPV_ARGS(&pdxcCompiler)), "Failed to create DXC Compiler");

        constexpr char TestShader[] = R"(
float4 main() : SV_Target0
{
    return float4(0.0, 0.0, 0.0, 0.0);
}
)";

        CComPtr<IDxcBlobEncoding> pSourceBlob;
        CHECK_D3D_RESULT(pdxcLibrary->CreateBlobWithEncodingFromPinned(TestShader, sizeof(TestShader), CP_UTF8, &pSourceBlob), "Failed to create DXC Blob Encoding");

        ShaderVersion MaxSM{6, 0};

        std::vector<const wchar_t*> DxilArgs;
        if (m_Target == DXCompilerTarget::Vulkan)
            DxilArgs.push_back(L"-spirv");

        for (Uint32 MinorVer = 1;; ++MinorVer)
        {
            std::wstring Profile = L"ps_6_";
            Profile += std::to_wstring(MinorVer);

            CComPtr<IDxcOperationResult> pdxcResult;

            auto hr = pdxcCompiler->Compile(
                pSourceBlob,
                L"",
                L"main",
                Profile.c_str(),
                !DxilArgs.empty() ? DxilArgs.data() : nullptr,
                static_cast<UINT32>(DxilArgs.size()),
                nullptr, // Array of defines
                0,       // Number of defines
                nullptr, // Include handler
                &pdxcResult);
            if (FAILED(hr))
                break;

            HRESULT status = E_FAIL;
            if (FAILED(pdxcResult->GetStatus(&status)))
                break;
            if (FAILED(status))
                break;

            MaxSM.Minor = MinorVer;
        }

        m_MaxShaderModel = MaxSM;
    }
    catch (...)
    {
        LOG_ERROR_MESSAGE("Failed to detect max shader model for DXC compiler");
    }
}